

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

Hop_Man_t * Abc_NtkHaigReconstruct(Hop_Man_t *p)

{
  void *pvVar1;
  Hop_Man_t *p_00;
  Vec_Ptr_t *p_01;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  int iVar5;
  
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,iVar5);
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  p_00 = Hop_ManStart();
  p_01 = Vec_PtrAlloc(p->nCreated);
  p_00->vObjs = p_01;
  Vec_PtrPush(p_01,p_00->pConst1);
  p->pConst1->field_1 = (anon_union_8_2_6d2434d6_for_Hop_Obj_t__2)p_00->pConst1;
  for (iVar5 = 0; iVar5 < p->vPis->nSize; iVar5 = iVar5 + 1) {
    pvVar1 = Vec_PtrEntry(p->vPis,iVar5);
    pHVar2 = Hop_ObjCreatePi(p_00);
    *(Hop_Obj_t **)((long)pvVar1 + 8) = pHVar2;
  }
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
    if ((*(uint *)&pHVar2->field_0x20 & 6) == 4) {
      pHVar3 = Hop_ObjChild0Hop(pHVar2);
      pHVar4 = Hop_ObjReprHop((Hop_Obj_t *)((ulong)pHVar2->pFanin1 & 0xfffffffffffffffe));
      pHVar3 = Hop_And(p_00,pHVar3,(Hop_Obj_t *)((ulong)((uint)pHVar2->pFanin1 & 1) ^ (ulong)pHVar4)
                      );
      (pHVar2->field_1).pNext = pHVar3;
      if ((pHVar2->field_0).pData != (void *)0x0) {
        *(ulong *)((ulong)pHVar3 & 0xfffffffffffffffe) =
             *(ulong *)((long)(pHVar2->field_0).pData + 8) & 0xfffffffffffffffe;
      }
    }
  }
  for (iVar5 = 0; iVar5 < p->vPos->nSize; iVar5 = iVar5 + 1) {
    pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,iVar5);
    pHVar2 = Hop_ObjChild0Hop(pHVar2);
    Hop_ObjCreatePo(p_00,pHVar2);
  }
  iVar5 = Hop_ManCheck(p_00);
  if (iVar5 == 0) {
    puts("Abc_NtkHaigReconstruct: Check for History AIG has failed.");
    Hop_ManStop(p_00);
    p_00 = (Hop_Man_t *)0x0;
  }
  return p_00;
}

Assistant:

Hop_Man_t * Abc_NtkHaigReconstruct( Hop_Man_t * p )
{ 
    Hop_Man_t * pNew;
    Hop_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
        pObj->pNext = NULL;
    // start the HOP package
    pNew = Hop_ManStart();
    pNew->vObjs = Vec_PtrAlloc( p->nCreated );
    Vec_PtrPush( pNew->vObjs, Hop_ManConst1(pNew) );
    // map the constant node
    Hop_ManConst1(p)->pNext = Hop_ManConst1(pNew);
    // map the CIs
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = Hop_ObjCreatePi(pNew);
    // map the internal nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = Hop_And( pNew, Hop_ObjChild0Hop(pObj), Hop_ObjChild1Hop(pObj) );
//        assert( !Hop_IsComplement(pObj->pNext) );
        if ( Hop_ManConst1(pNew) == Hop_Regular(pObj->pNext) )
            Counter++;
        if ( pObj->pData ) // member of the class
            Hop_Regular(pObj->pNext)->pData = Hop_Regular(((Hop_Obj_t *)pObj->pData)->pNext);
    }
//    printf( " Counter = %d.\n", Counter );
    // transfer the POs
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjCreatePo( pNew, Hop_ObjChild0Hop(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pNew) )
    {
        printf( "Abc_NtkHaigReconstruct: Check for History AIG has failed.\n" );
        Hop_ManStop(pNew);
        return NULL;
    }
    return pNew;
}